

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpstream.cpp
# Opt level: O1

bool __thiscall TCPStream::waitForReadEvent(TCPStream *this,int timeout)

{
  int iVar1;
  int iVar2;
  timeval tv;
  fd_set sdset;
  timeval local_98;
  fd_set local_88;
  
  local_98.tv_sec = (__time_t)timeout;
  local_98.tv_usec = 0;
  local_88.fds_bits[0] = 0;
  local_88.fds_bits[1] = 0;
  local_88.fds_bits[2] = 0;
  local_88.fds_bits[3] = 0;
  local_88.fds_bits[4] = 0;
  local_88.fds_bits[5] = 0;
  local_88.fds_bits[6] = 0;
  local_88.fds_bits[7] = 0;
  local_88.fds_bits[8] = 0;
  local_88.fds_bits[9] = 0;
  local_88.fds_bits[10] = 0;
  local_88.fds_bits[0xb] = 0;
  local_88.fds_bits[0xc] = 0;
  local_88.fds_bits[0xd] = 0;
  local_88.fds_bits[0xe] = 0;
  local_88.fds_bits[0xf] = 0;
  iVar2 = this->m_sd;
  iVar1 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  local_88.fds_bits[iVar1 >> 6] =
       local_88.fds_bits[iVar1 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
  iVar2 = select(iVar2 + 1,&local_88,(fd_set *)0x0,(fd_set *)0x0,&local_98);
  return 0 < iVar2;
}

Assistant:

bool TCPStream::waitForReadEvent(int timeout)
{
    fd_set sdset;
    struct timeval tv;

    tv.tv_sec = timeout;
    tv.tv_usec = 0;
    FD_ZERO(&sdset);
    FD_SET(m_sd, &sdset);
    return select(m_sd + 1, &sdset, nullptr, nullptr, &tv) > 0;
}